

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool __thiscall
cmStringCommand::InitialPass
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar1;
  allocator<char> local_39;
  string e;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if (__lhs == (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"must be called with at least one argument.",&local_39);
    cmCommand::SetError(&this->super_cmCommand,&e);
LAB_00207056:
    std::__cxx11::string::~string((string *)&e);
    return false;
  }
  bVar1 = std::operator==(__lhs,"REGEX");
  if (bVar1) {
    bVar1 = HandleRegexCommand(this,args);
    return bVar1;
  }
  bVar1 = std::operator==(__lhs,"REPLACE");
  if (bVar1) {
    bVar1 = HandleReplaceCommand(this,args);
    return bVar1;
  }
  bVar1 = std::operator==(__lhs,"MD5");
  if (!bVar1) {
    bVar1 = std::operator==(__lhs,"SHA1");
    if (!bVar1) {
      bVar1 = std::operator==(__lhs,"SHA224");
      if (!bVar1) {
        bVar1 = std::operator==(__lhs,"SHA256");
        if (!bVar1) {
          bVar1 = std::operator==(__lhs,"SHA384");
          if (!bVar1) {
            bVar1 = std::operator==(__lhs,"SHA512");
            if (!bVar1) {
              bVar1 = std::operator==(__lhs,"SHA3_224");
              if (!bVar1) {
                bVar1 = std::operator==(__lhs,"SHA3_256");
                if (!bVar1) {
                  bVar1 = std::operator==(__lhs,"SHA3_384");
                  if (!bVar1) {
                    bVar1 = std::operator==(__lhs,"SHA3_512");
                    if (!bVar1) {
                      bVar1 = std::operator==(__lhs,"TOLOWER");
                      if (bVar1) {
                        bVar1 = false;
                      }
                      else {
                        bVar1 = std::operator==(__lhs,"TOUPPER");
                        if (!bVar1) {
                          bVar1 = std::operator==(__lhs,"COMPARE");
                          if (bVar1) {
                            bVar1 = HandleCompareCommand(this,args);
                            return bVar1;
                          }
                          bVar1 = std::operator==(__lhs,"ASCII");
                          if (bVar1) {
                            bVar1 = HandleAsciiCommand(this,args);
                            return bVar1;
                          }
                          bVar1 = std::operator==(__lhs,"CONFIGURE");
                          if (bVar1) {
                            bVar1 = HandleConfigureCommand(this,args);
                            return bVar1;
                          }
                          bVar1 = std::operator==(__lhs,"LENGTH");
                          if (bVar1) {
                            bVar1 = HandleLengthCommand(this,args);
                            return bVar1;
                          }
                          bVar1 = std::operator==(__lhs,"APPEND");
                          if (bVar1) {
                            bVar1 = HandleAppendCommand(this,args);
                            return bVar1;
                          }
                          bVar1 = std::operator==(__lhs,"PREPEND");
                          if (bVar1) {
                            bVar1 = HandlePrependCommand(this,args);
                            return bVar1;
                          }
                          bVar1 = std::operator==(__lhs,"CONCAT");
                          if (bVar1) {
                            bVar1 = HandleConcatCommand(this,args);
                            return bVar1;
                          }
                          bVar1 = std::operator==(__lhs,"JOIN");
                          if (bVar1) {
                            bVar1 = HandleJoinCommand(this,args);
                            return bVar1;
                          }
                          bVar1 = std::operator==(__lhs,"SUBSTRING");
                          if (bVar1) {
                            bVar1 = HandleSubstringCommand(this,args);
                            return bVar1;
                          }
                          bVar1 = std::operator==(__lhs,"STRIP");
                          if (bVar1) {
                            bVar1 = HandleStripCommand(this,args);
                            return bVar1;
                          }
                          bVar1 = std::operator==(__lhs,"RANDOM");
                          if (bVar1) {
                            bVar1 = HandleRandomCommand(this,args);
                            return bVar1;
                          }
                          bVar1 = std::operator==(__lhs,"FIND");
                          if (bVar1) {
                            bVar1 = HandleFindCommand(this,args);
                            return bVar1;
                          }
                          bVar1 = std::operator==(__lhs,"TIMESTAMP");
                          if (bVar1) {
                            bVar1 = HandleTimestampCommand(this,args);
                            return bVar1;
                          }
                          bVar1 = std::operator==(__lhs,"MAKE_C_IDENTIFIER");
                          if (bVar1) {
                            bVar1 = HandleMakeCIdentifierCommand(this,args);
                            return bVar1;
                          }
                          bVar1 = std::operator==(__lhs,"GENEX_STRIP");
                          if (bVar1) {
                            bVar1 = HandleGenexStripCommand(this,args);
                            return bVar1;
                          }
                          bVar1 = std::operator==(__lhs,"UUID");
                          if (bVar1) {
                            bVar1 = HandleUuidCommand(this,args);
                            return bVar1;
                          }
                          std::operator+(&e,"does not recognize sub-command ",__lhs);
                          cmCommand::SetError(&this->super_cmCommand,&e);
                          goto LAB_00207056;
                        }
                        bVar1 = true;
                      }
                      bVar1 = HandleToUpperLowerCommand(this,args,bVar1);
                      return bVar1;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  bVar1 = HandleHashCommand(this,args);
  return bVar1;
}

Assistant:

bool cmStringCommand::InitialPass(std::vector<std::string> const& args,
                                  cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("must be called with at least one argument.");
    return false;
  }

  const std::string& subCommand = args[0];
  if (subCommand == "REGEX") {
    return this->HandleRegexCommand(args);
  }
  if (subCommand == "REPLACE") {
    return this->HandleReplaceCommand(args);
  }
  if (subCommand == "MD5" || subCommand == "SHA1" || subCommand == "SHA224" ||
      subCommand == "SHA256" || subCommand == "SHA384" ||
      subCommand == "SHA512" || subCommand == "SHA3_224" ||
      subCommand == "SHA3_256" || subCommand == "SHA3_384" ||
      subCommand == "SHA3_512") {
    return this->HandleHashCommand(args);
  }
  if (subCommand == "TOLOWER") {
    return this->HandleToUpperLowerCommand(args, false);
  }
  if (subCommand == "TOUPPER") {
    return this->HandleToUpperLowerCommand(args, true);
  }
  if (subCommand == "COMPARE") {
    return this->HandleCompareCommand(args);
  }
  if (subCommand == "ASCII") {
    return this->HandleAsciiCommand(args);
  }
  if (subCommand == "CONFIGURE") {
    return this->HandleConfigureCommand(args);
  }
  if (subCommand == "LENGTH") {
    return this->HandleLengthCommand(args);
  }
  if (subCommand == "APPEND") {
    return this->HandleAppendCommand(args);
  }
  if (subCommand == "PREPEND") {
    return this->HandlePrependCommand(args);
  }
  if (subCommand == "CONCAT") {
    return this->HandleConcatCommand(args);
  }
  if (subCommand == "JOIN") {
    return this->HandleJoinCommand(args);
  }
  if (subCommand == "SUBSTRING") {
    return this->HandleSubstringCommand(args);
  }
  if (subCommand == "STRIP") {
    return this->HandleStripCommand(args);
  }
  if (subCommand == "RANDOM") {
    return this->HandleRandomCommand(args);
  }
  if (subCommand == "FIND") {
    return this->HandleFindCommand(args);
  }
  if (subCommand == "TIMESTAMP") {
    return this->HandleTimestampCommand(args);
  }
  if (subCommand == "MAKE_C_IDENTIFIER") {
    return this->HandleMakeCIdentifierCommand(args);
  }
  if (subCommand == "GENEX_STRIP") {
    return this->HandleGenexStripCommand(args);
  }
  if (subCommand == "UUID") {
    return this->HandleUuidCommand(args);
  }

  std::string e = "does not recognize sub-command " + subCommand;
  this->SetError(e);
  return false;
}